

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O3

qint64 __thiscall
QNativeSocketEnginePrivate::nativeReceiveDatagram
          (QNativeSocketEnginePrivate *this,char *data,qint64 maxSize,QIpPacketHeader *header,
          PacketHeaderOptions options)

{
  QHostAddress *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  cmsghdr *__cmsg;
  ErrorString errorString;
  SocketError error;
  long in_FS_OFFSET;
  QString local_108;
  char local_e9;
  iovec local_e8;
  msghdr local_d8;
  qt_sockaddr local_98;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.msg_name = (qt_sockaddr *)0x0;
  local_d8.msg_namelen = 0;
  local_d8._12_4_ = 0;
  local_d8.msg_control = (cmsghdr *)0x0;
  local_d8.msg_controllen = 0;
  local_d8.msg_flags = 0;
  local_d8._52_4_ = 0;
  local_98._0_8_ = 0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_4_ = 0;
  local_98._20_8_ = 0;
  local_e8.iov_base = &local_e9;
  if (maxSize != 0) {
    local_e8.iov_base = data;
  }
  local_d8.msg_iov = &local_e8;
  local_e8.iov_len = maxSize + (ulong)(maxSize == 0);
  local_d8.msg_iovlen = 1;
  if (((uint)options.super_QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4>.
             super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i & 1) != 0) {
    local_d8.msg_name = &local_98;
    local_d8.msg_namelen = 0x1c;
    local_d8._12_4_ = 0;
  }
  if (((uint)options.super_QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4>.
             super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i & 0xe) != 0) {
    local_d8.msg_control = local_78;
    local_d8.msg_controllen = 0x40;
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e9 = -0x56;
  do {
    uVar4 = recvmsg((int)this->socketDescriptor,&local_d8,0);
    if (uVar4 != 0xffffffffffffffff) {
      if ((QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>)
          options.super_QFlagsStorageHelper<QAbstractSocketEngine::PacketHeaderOption,_4>.
          super_QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>.i ==
          (QFlagsStorage<QAbstractSocketEngine::PacketHeaderOption>)0x0) goto LAB_00230056;
      qt_socket_getPortAndAddress(&local_98,&header->senderPort,&header->senderAddress);
      header->destinationPort = (this->super_QAbstractSocketEnginePrivate).localPort;
      header->endOfRecord = (bool)((byte)local_d8.msg_flags >> 7);
      if ((cmsghdr *)local_d8.msg_control == (cmsghdr *)0x0 || local_d8.msg_controllen < 0x10)
      goto LAB_00230056;
      this_00 = &header->destinationAddress;
      __cmsg = (cmsghdr *)local_d8.msg_control;
      goto LAB_0022ff07;
    }
    piVar5 = __errno_location();
    iVar3 = *piVar5;
  } while (iVar3 == 4);
  if (iVar3 == 0xb) {
    uVar4 = 0xfffffffffffffffe;
  }
  else {
    if (iVar3 == 0x6f) {
      error = ConnectionRefusedError;
      errorString = ConnectionRefusedErrorString;
    }
    else {
      error = NetworkError;
      errorString = ReceiveDatagramErrorString;
    }
    setError(this,error,errorString);
    uVar4 = 0xffffffffffffffff;
  }
  if (header != (QIpPacketHeader *)0x0) {
    QHostAddress::clear(&header->senderAddress);
    QHostAddress::clear(&header->destinationAddress);
    header->ifindex = 0;
    header->hopLimit = -1;
    header->streamNumber = -1;
    header->endOfRecord = false;
  }
  goto LAB_00230056;
  while (__cmsg = __cmsg_nxthdr(&local_d8,__cmsg), __cmsg != (cmsghdr *)0x0) {
LAB_0022ff07:
    iVar3 = __cmsg->cmsg_level;
    if (iVar3 == 0x29) {
      if ((__cmsg->cmsg_type == 0x32) && (0x23 < __cmsg->cmsg_len)) {
        QHostAddress::setAddress(this_00,(quint8 *)(__cmsg + 1));
        uVar1 = (uint)__cmsg[2].cmsg_len;
        header->ifindex = uVar1;
        if (uVar1 != 0) {
          QString::number((uint)&local_108,uVar1);
          QHostAddress::setScopeId(this_00,&local_108);
          if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      iVar3 = __cmsg->cmsg_level;
    }
    if ((iVar3 == 0) && (__cmsg->cmsg_type == 8)) {
      uVar6 = __cmsg->cmsg_len;
      if (0x1b < uVar6) {
        uVar2 = __cmsg[1].cmsg_level;
        QHostAddress::setAddress
                  (this_00,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
        header->ifindex = (uint)__cmsg[1].cmsg_len;
        goto LAB_0022ffba;
      }
    }
    else {
LAB_0022ffba:
      uVar6 = __cmsg->cmsg_len;
    }
    if (uVar6 == 0x14) {
      if (__cmsg->cmsg_level == 0) {
        if (__cmsg->cmsg_type == 2) goto LAB_0022ffda;
      }
      else if ((__cmsg->cmsg_level == 0x29) && (__cmsg->cmsg_type == 0x34)) {
LAB_0022ffda:
        header->hopLimit = (int)__cmsg[1].cmsg_len;
      }
    }
  }
LAB_00230056:
  uVar6 = (long)uVar4 >> 0x3f & uVar4;
  if (maxSize != 0) {
    uVar6 = uVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

qint64 QNativeSocketEnginePrivate::nativeReceiveDatagram(char *data, qint64 maxSize, QIpPacketHeader *header,
                                                         QAbstractSocketEngine::PacketHeaderOptions options)
{
    // we use quintptr to force the alignment
    quintptr cbuf[(CMSG_SPACE(sizeof(struct in6_pktinfo)) + CMSG_SPACE(sizeof(int))
#if !defined(IP_PKTINFO) && defined(IP_RECVIF) && defined(Q_OS_BSD4)
                   + CMSG_SPACE(sizeof(sockaddr_dl))
#endif
#ifndef QT_NO_SCTP
                   + CMSG_SPACE(sizeof(struct sctp_sndrcvinfo))
#endif
                   + sizeof(quintptr) - 1) / sizeof(quintptr)];

    struct msghdr msg;
    struct iovec vec;
    qt_sockaddr aa;
    char c;
    memset(&msg, 0, sizeof(msg));
    memset(&aa, 0, sizeof(aa));

    // we need to receive at least one byte, even if our user isn't interested in it
    vec.iov_base = maxSize ? data : &c;
    vec.iov_len = maxSize ? maxSize : 1;
    msg.msg_iov = &vec;
    msg.msg_iovlen = 1;
    if (options & QAbstractSocketEngine::WantDatagramSender) {
        msg.msg_name = &aa;
        msg.msg_namelen = sizeof(aa);
    }
    if (options & (QAbstractSocketEngine::WantDatagramHopLimit | QAbstractSocketEngine::WantDatagramDestination
                   | QAbstractSocketEngine::WantStreamNumber)) {
        msg.msg_control = cbuf;
        msg.msg_controllen = sizeof(cbuf);
    }

    ssize_t recvResult = 0;
    do {
        recvResult = ::recvmsg(socketDescriptor, &msg, 0);
    } while (recvResult == -1 && errno == EINTR);

    if (recvResult == -1) {
        switch (errno) {
#if defined(EWOULDBLOCK) && EWOULDBLOCK != EAGAIN
        case EWOULDBLOCK:
#endif
        case EAGAIN:
            // No datagram was available for reading
            recvResult = -2;
            break;
        case ECONNREFUSED:
            setError(QAbstractSocket::ConnectionRefusedError, ConnectionRefusedErrorString);
            break;
        default:
            setError(QAbstractSocket::NetworkError, ReceiveDatagramErrorString);
        }
        if (header)
            header->clear();
    } else if (options != QAbstractSocketEngine::WantNone) {
        Q_ASSERT(header);
        qt_socket_getPortAndAddress(&aa, &header->senderPort, &header->senderAddress);
        header->destinationPort = localPort;
        header->endOfRecord = (msg.msg_flags & MSG_EOR) != 0;

        // parse the ancillary data
        struct cmsghdr *cmsgptr;
        QT_WARNING_PUSH
        QT_WARNING_DISABLE_CLANG("-Wsign-compare")
        for (cmsgptr = CMSG_FIRSTHDR(&msg); cmsgptr != nullptr;
             cmsgptr = CMSG_NXTHDR(&msg, cmsgptr)) {
            QT_WARNING_POP
            if (cmsgptr->cmsg_level == IPPROTO_IPV6 && cmsgptr->cmsg_type == IPV6_PKTINFO
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in6_pktinfo))) {
                in6_pktinfo *info = reinterpret_cast<in6_pktinfo *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(reinterpret_cast<quint8 *>(&info->ipi6_addr));
                header->ifindex = info->ipi6_ifindex;
                if (header->ifindex)
                    header->destinationAddress.setScopeId(QString::number(info->ipi6_ifindex));
            }

#ifdef IP_PKTINFO
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_PKTINFO
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in_pktinfo))) {
                in_pktinfo *info = reinterpret_cast<in_pktinfo *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(ntohl(info->ipi_addr.s_addr));
                header->ifindex = info->ipi_ifindex;
            }
#else
#  ifdef IP_RECVDSTADDR
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_RECVDSTADDR
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(in_addr))) {
                in_addr *addr = reinterpret_cast<in_addr *>(CMSG_DATA(cmsgptr));

                header->destinationAddress.setAddress(ntohl(addr->s_addr));
            }
#  endif
#  if defined(IP_RECVIF) && defined(Q_OS_BSD4)
            if (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_RECVIF
                    && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(sockaddr_dl))) {
                sockaddr_dl *sdl = reinterpret_cast<sockaddr_dl *>(CMSG_DATA(cmsgptr));
                header->ifindex = sdl->sdl_index;
            }
#  endif
#endif

            if (cmsgptr->cmsg_len == CMSG_LEN(sizeof(int))
                    && ((cmsgptr->cmsg_level == IPPROTO_IPV6 && cmsgptr->cmsg_type == IPV6_HOPLIMIT)
                        || (cmsgptr->cmsg_level == IPPROTO_IP && cmsgptr->cmsg_type == IP_TTL))) {
                static_assert(sizeof(header->hopLimit) == sizeof(int));
                memcpy(&header->hopLimit, CMSG_DATA(cmsgptr), sizeof(header->hopLimit));
            }

#ifndef QT_NO_SCTP
            if (cmsgptr->cmsg_level == IPPROTO_SCTP && cmsgptr->cmsg_type == SCTP_SNDRCV
                && cmsgptr->cmsg_len >= CMSG_LEN(sizeof(sctp_sndrcvinfo))) {
                sctp_sndrcvinfo *rcvInfo = reinterpret_cast<sctp_sndrcvinfo *>(CMSG_DATA(cmsgptr));

                header->streamNumber = int(rcvInfo->sinfo_stream);
            }
#endif
        }
    }

#if defined (QNATIVESOCKETENGINE_DEBUG)
    qDebug("QNativeSocketEnginePrivate::nativeReceiveDatagram(%p \"%s\", %lli, %s, %i) == %lli",
           data, QtDebugUtils::toPrintable(data, recvResult, 16).constData(), maxSize,
           (recvResult != -1 && options != QAbstractSocketEngine::WantNone)
           ? header->senderAddress.toString().toLatin1().constData() : "(unknown)",
           (recvResult != -1 && options != QAbstractSocketEngine::WantNone)
           ? header->senderPort : 0, (qint64) recvResult);
#endif

    return qint64((maxSize || recvResult < 0) ? recvResult : Q_INT64_C(0));
}